

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  uint uVar5;
  __m256i c;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  int iVar6;
  int iVar7;
  ulong uVar8;
  parasail_result_t *result;
  __m256i *palVar9;
  __m256i *ptr;
  __m256i *palVar10;
  __m256i *b_09;
  long lVar11;
  __m256i *palVar12;
  char *pcVar13;
  long lVar14;
  __m256i *palVar15;
  int iVar16;
  char *__format;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong size;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar27 [64];
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 uVar28;
  long lVar29;
  __m256i *palVar30;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 local_138 [32];
  undefined1 auVar26 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "profile";
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar13 = "profile->profile64.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar13 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar13 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar13 = "s2";
        }
        else {
          uVar17 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar13 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar13 = "open";
          }
          else {
            if (-1 < gap) {
              uVar8 = (ulong)ppVar4->max;
              result = parasail_result_new();
              if (result != (parasail_result_t *)0x0) {
                size = (ulong)uVar2 + 3 >> 2;
                result->flag = result->flag | 0x4800804;
                palVar9 = parasail_memalign___m256i(0x20,size);
                ptr = parasail_memalign___m256i(0x20,size);
                palVar10 = parasail_memalign___m256i(0x20,size);
                b_09 = parasail_memalign___m256i(0x20,size);
                iVar16 = 0;
                uVar28 = 0;
                if ((b_09 != (__m256i *)0x0 && palVar10 != (__m256i *)0x0) &&
                    (ptr != (__m256i *)0x0 && palVar9 != (__m256i *)0x0)) {
                  auVar20._4_4_ = 0;
                  auVar20._0_4_ = open;
                  auVar20._8_4_ = open;
                  auVar20._12_4_ = 0;
                  auVar20._16_4_ = open;
                  auVar20._20_4_ = 0;
                  auVar20._24_4_ = open;
                  auVar20._28_4_ = 0;
                  auVar21._4_4_ = 0;
                  auVar21._0_4_ = gap;
                  auVar21._8_4_ = gap;
                  auVar21._12_4_ = 0;
                  auVar21._16_4_ = gap;
                  auVar21._20_4_ = 0;
                  auVar21._24_4_ = gap;
                  auVar21._28_4_ = 0;
                  lVar11 = ~uVar8 + 0x7fffffffffffffff;
                  alVar1[1] = in_stack_fffffffffffffe60;
                  alVar1[0] = in_stack_fffffffffffffe58;
                  alVar1[2] = 0;
                  alVar1[3] = (longlong)palVar10;
                  parasail_memset___m256i(palVar9,alVar1,size);
                  c[1] = in_stack_fffffffffffffe60;
                  c[0] = in_stack_fffffffffffffe58;
                  c[2]._0_4_ = iVar16;
                  c[2]._4_4_ = uVar28;
                  c[3] = (longlong)palVar10;
                  palVar12 = b_09;
                  parasail_memset___m256i(b_09,c,size);
                  uVar5 = (uint)size;
                  auVar24._8_8_ = 0xc000000000000000;
                  auVar24._0_8_ = 0xc000000000000000;
                  auVar24._16_8_ = 0xc000000000000000;
                  auVar24._24_8_ = 0xc000000000000000;
                  auVar26 = ZEXT3264(auVar24);
                  lVar29 = -0x4000000000000000;
                  uVar8 = 0;
                  do {
                    if (uVar8 == uVar17) {
LAB_00719897:
                      if (lVar29 == 0x7fffffffffffffff) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                      }
                      iVar7 = parasail_result_is_saturated(result);
                      palVar12 = palVar10;
                      if (iVar7 == 0) {
                        iVar7 = (int)uVar17 + -1;
                        iVar6 = (int)uVar17 + -2;
                        if (iVar16 == iVar6) {
                          palVar12 = ptr;
                        }
                        if (iVar16 == iVar7) {
                          palVar12 = palVar9;
                          palVar9 = palVar10;
                        }
                        iVar19 = uVar2 - 1;
                        for (uVar17 = 0; (uVar5 & 0x1fffffff) << 2 != (uint)uVar17;
                            uVar17 = uVar17 + 1) {
                          if (((*palVar12)[uVar17] == lVar29) &&
                             (iVar18 = ((uint)uVar17 & 3) * uVar5 +
                                       ((uint)(uVar17 >> 2) & 0x3fffffff), iVar18 < iVar19)) {
                            iVar19 = iVar18;
                          }
                        }
                        if (iVar16 != iVar6) {
                          palVar10 = ptr;
                        }
                        if (iVar16 != iVar7) {
                          ptr = palVar10;
                        }
                      }
                      else {
                        iVar16 = 0;
                        lVar29 = -1;
                        iVar19 = 0;
                      }
                      result->score = (int)lVar29;
                      result->end_query = iVar19;
                      result->end_ref = iVar16;
                      parasail_free(b_09);
                      parasail_free(palVar12);
                      parasail_free(ptr);
                      parasail_free(palVar9);
                      return result;
                    }
                    local_138 = auVar26._0_32_;
                    alVar1 = palVar9[uVar5 - 1];
                    auVar22 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                    auVar22 = vpalignr_avx2((undefined1  [32])alVar1,auVar22,8);
                    iVar7 = ppVar4->mapper[(byte)s2[uVar8]];
                    iVar6 = (int)uVar8 + -2;
                    palVar15 = ptr;
                    if (iVar16 == iVar6) {
                      palVar15 = palVar10;
                    }
                    auVar27 = ZEXT1664((undefined1  [16])0x0);
                    palVar30 = ptr;
                    for (lVar14 = 0; ptr = palVar9, size * 0x20 != lVar14; lVar14 = lVar14 + 0x20) {
                      auVar22 = vpaddq_avx2(auVar22,*(undefined1 (*) [32])
                                                     ((long)pvVar3 +
                                                     lVar14 + (long)(int)(iVar7 * uVar5) * 0x20));
                      auVar25 = *(undefined1 (*) [32])((long)*b_09 + lVar14);
                      a[1] = (longlong)ptr;
                      a[0] = in_stack_fffffffffffffe58;
                      a[2]._0_4_ = iVar16;
                      a[2]._4_4_ = uVar28;
                      a[3] = (longlong)palVar10;
                      b[1] = lVar11;
                      b[0] = lVar29;
                      b[2] = (longlong)palVar30;
                      b[3]._0_4_ = in_stack_fffffffffffffe90;
                      b[3]._4_4_ = iVar6;
                      _mm256_max_epi64_rpl(palVar12,a,b);
                      a_00[1] = (longlong)ptr;
                      a_00[0] = in_stack_fffffffffffffe58;
                      a_00[2]._0_4_ = iVar16;
                      a_00[2]._4_4_ = uVar28;
                      a_00[3] = (longlong)palVar10;
                      b_00[1] = lVar11;
                      b_00[0] = lVar29;
                      b_00[2] = (longlong)palVar30;
                      b_00[3]._0_4_ = in_stack_fffffffffffffe90;
                      b_00[3]._4_4_ = iVar6;
                      _mm256_max_epi64_rpl(palVar12,a_00,b_00);
                      a_01[1] = (longlong)ptr;
                      a_01[0] = in_stack_fffffffffffffe58;
                      a_01[2]._0_4_ = iVar16;
                      a_01[2]._4_4_ = uVar28;
                      a_01[3] = (longlong)palVar10;
                      b_01[1] = lVar11;
                      b_01[0] = lVar29;
                      b_01[2] = (longlong)palVar30;
                      b_01[3]._0_4_ = in_stack_fffffffffffffe90;
                      b_01[3]._4_4_ = iVar6;
                      _mm256_max_epi64_rpl(palVar12,a_01,b_01);
                      *(undefined1 (*) [32])((long)*palVar15 + lVar14) = auVar22;
                      a_02[1] = (longlong)ptr;
                      a_02[0] = in_stack_fffffffffffffe58;
                      a_02[2]._0_4_ = iVar16;
                      a_02[2]._4_4_ = uVar28;
                      a_02[3] = (longlong)palVar10;
                      b_02[1] = lVar11;
                      b_02[0] = lVar29;
                      b_02[2] = (longlong)palVar30;
                      b_02[3]._0_4_ = in_stack_fffffffffffffe90;
                      b_02[3]._4_4_ = iVar6;
                      local_138 = auVar22;
                      _mm256_max_epi64_rpl(palVar12,a_02,b_02);
                      vpsubq_avx2(auVar22,auVar20);
                      auVar22 = vpsubq_avx2(auVar25,auVar21);
                      a_03[1] = (longlong)ptr;
                      a_03[0] = in_stack_fffffffffffffe58;
                      a_03[2]._0_4_ = iVar16;
                      a_03[2]._4_4_ = uVar28;
                      a_03[3] = (longlong)palVar10;
                      b_03[1] = lVar11;
                      b_03[0] = lVar29;
                      b_03[2] = (longlong)palVar30;
                      b_03[3]._0_4_ = in_stack_fffffffffffffe90;
                      b_03[3]._4_4_ = iVar6;
                      _mm256_max_epi64_rpl(palVar12,a_03,b_03);
                      *(undefined1 (*) [32])((long)*b_09 + lVar14) = auVar22;
                      auVar22 = vpsubq_avx2(auVar27._0_32_,auVar21);
                      a_04[1] = (longlong)ptr;
                      a_04[0] = in_stack_fffffffffffffe58;
                      a_04[2]._0_4_ = iVar16;
                      a_04[2]._4_4_ = uVar28;
                      a_04[3] = (longlong)palVar10;
                      b_04[1] = lVar11;
                      b_04[0] = lVar29;
                      b_04[2] = (longlong)palVar30;
                      b_04[3]._0_4_ = in_stack_fffffffffffffe90;
                      b_04[3]._4_4_ = iVar6;
                      _mm256_max_epi64_rpl(palVar12,a_04,b_04);
                      auVar27 = ZEXT3264(auVar22);
                      auVar22 = *(undefined1 (*) [32])((long)*ptr + lVar14);
                      palVar9 = ptr;
                    }
                    if (iVar16 == iVar6) {
                      palVar10 = palVar30;
                    }
                    auVar26 = ZEXT3264(local_138);
                    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
                      auVar25 = auVar27._0_32_;
                      auVar22 = vperm2i128_avx2(auVar25,auVar25,8);
                      auVar22 = vpalignr_avx2(auVar25,auVar22,8);
                      lVar14 = 0;
                      while( true ) {
                        auVar27 = ZEXT3264(auVar22);
                        if (size * 0x20 + 0x20 == lVar14 + 0x20) break;
                        auVar25 = *(undefined1 (*) [32])((long)*palVar15 + lVar14);
                        a_05[1] = (longlong)ptr;
                        a_05[0] = in_stack_fffffffffffffe58;
                        a_05[2]._0_4_ = iVar16;
                        a_05[2]._4_4_ = uVar28;
                        a_05[3] = (longlong)palVar10;
                        b_05[1] = lVar11;
                        b_05[0] = lVar29;
                        b_05[2] = (longlong)palVar30;
                        b_05[3]._0_4_ = in_stack_fffffffffffffe90;
                        b_05[3]._4_4_ = iVar6;
                        _mm256_max_epi64_rpl(palVar12,a_05,b_05);
                        *(undefined1 (*) [32])((long)*palVar15 + lVar14) = auVar25;
                        a_06[1] = (longlong)ptr;
                        a_06[0] = in_stack_fffffffffffffe58;
                        a_06[2]._0_4_ = iVar16;
                        a_06[2]._4_4_ = uVar28;
                        a_06[3] = (longlong)palVar10;
                        b_06[1] = lVar11;
                        b_06[0] = lVar29;
                        b_06[2] = (longlong)palVar30;
                        b_06[3]._0_4_ = in_stack_fffffffffffffe90;
                        b_06[3]._4_4_ = iVar6;
                        auVar23 = auVar25;
                        _mm256_max_epi64_rpl(palVar12,a_06,b_06);
                        auVar26 = ZEXT3264(auVar23);
                        auVar25 = vpsubq_avx2(auVar25,auVar20);
                        auVar22 = vpsubq_avx2(auVar22,auVar21);
                        auVar25 = vpcmpgtq_avx2(auVar22,auVar25);
                        lVar14 = lVar14 + 0x20;
                        if ((((auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             SUB321(auVar25 >> 0x7f,0) == '\0') && SUB321(auVar25 >> 0xbf,0) == '\0'
                            ) && -1 < auVar25[0x1f]) goto LAB_007197fe;
                      }
                    }
LAB_007197fe:
                    auVar25 = auVar26._0_32_;
                    auVar22 = vpcmpgtq_avx2(auVar25,auVar24);
                    palVar9 = palVar15;
                    if ((((auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         SUB321(auVar22 >> 0x7f,0) != '\0') || SUB321(auVar22 >> 0xbf,0) != '\0') ||
                        auVar22[0x1f] < '\0') {
                      vpermq_avx2(auVar25,0x44);
                      a_07[1] = (longlong)ptr;
                      a_07[0] = in_stack_fffffffffffffe58;
                      a_07[2]._0_4_ = iVar16;
                      a_07[2]._4_4_ = uVar28;
                      a_07[3] = (longlong)palVar10;
                      b_07[1] = lVar11;
                      b_07[0] = lVar29;
                      b_07[2] = (longlong)palVar30;
                      b_07[3]._0_4_ = in_stack_fffffffffffffe90;
                      b_07[3]._4_4_ = iVar6;
                      auVar24 = auVar25;
                      _mm256_max_epi64_rpl(palVar12,a_07,b_07);
                      vpslldq_avx2(auVar24,8);
                      a_08[1] = (longlong)ptr;
                      a_08[0] = in_stack_fffffffffffffe58;
                      a_08[2]._0_4_ = iVar16;
                      a_08[2]._4_4_ = uVar28;
                      a_08[3] = (longlong)palVar10;
                      b_08[1] = lVar11;
                      b_08[0] = lVar29;
                      b_08[2] = (longlong)palVar30;
                      b_08[3]._0_4_ = in_stack_fffffffffffffe90;
                      b_08[3]._4_4_ = iVar6;
                      _mm256_max_epi64_rpl(palVar12,a_08,b_08);
                      lVar29 = vpextrq_avx(auVar24._16_16_,1);
                      if (lVar11 < lVar29) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                        uVar17 = uVar8;
                        goto LAB_00719897;
                      }
                      auVar24 = vpermq_avx2(auVar24,0xff);
                      uVar28 = 0;
                      auVar26 = ZEXT3264(auVar25);
                      iVar16 = (int)uVar8;
                    }
                    uVar8 = uVar8 + 1;
                  } while( true );
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar13 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_striped_profile_avx2_256_64",pcVar13);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int64_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}